

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O1

unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
__thiscall
TasGrid::GridReaderVersion5<TasGrid::GridLocalPolynomial>::read<TasGrid::IO::mode_ascii_type>
          (GridReaderVersion5<TasGrid::GridLocalPolynomial> *this,AccelerationContext *acc,
          istream *is)

{
  long lVar1;
  int *piVar2;
  TypeOneDRule TVar3;
  undefined8 *puVar4;
  int iVar5;
  unsigned_long num_entries;
  int *num_entries_00;
  pointer *__ptr;
  long lVar6;
  iterator __begin0;
  pointer piVar7;
  int *piVar8;
  pointer piVar9;
  bool bVar10;
  int v;
  int v_4;
  undefined1 local_70 [16];
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  puVar4 = (undefined8 *)operator_new(0x150);
  puVar4[1] = acc;
  puVar4[2] = 0;
  puVar4[3] = 0;
  *(undefined4 *)(puVar4 + 4) = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[7] = 0;
  puVar4[8] = 0;
  *(undefined4 *)(puVar4 + 9) = 0;
  puVar4[10] = 0;
  puVar4[0xb] = 0;
  puVar4[0xc] = 0;
  puVar4[0xd] = 0;
  puVar4[0xe] = 0;
  puVar4[0xf] = 0;
  puVar4[0x10] = 0;
  puVar4[0x11] = 0;
  *puVar4 = &PTR__GridLocalPolynomial_001f6610;
  *(undefined4 *)(puVar4 + 0x12) = 1;
  memset((int *)((long)puVar4 + 0x94),0,0x9c);
  puVar4[0x27] = 0;
  puVar4[0x28] = 0;
  puVar4[0x29] = 0;
  *(undefined8 **)this = puVar4;
  ::std::istream::operator>>((istream *)is,(int *)local_70);
  *(undefined4 *)(puVar4 + 2) = local_70._0_4_;
  ::std::istream::operator>>((istream *)is,(int *)local_70);
  *(undefined4 *)((long)puVar4 + 0x14) = local_70._0_4_;
  ::std::istream::operator>>((istream *)is,(int *)local_70);
  *(undefined4 *)(puVar4 + 0x12) = local_70._0_4_;
  ::std::istream::operator>>((istream *)is,(int *)local_70);
  *(int *)((long)puVar4 + 0x94) = local_70._0_4_;
  TVar3 = IO::readRule<TasGrid::IO::mode_ascii_type>(is);
  if (*(int *)(puVar4 + 0x12) == 0) {
    num_entries = 0;
  }
  else {
    num_entries = 1;
    if (TVar3 - rule_localp0 < 3) {
      num_entries = (unsigned_long)*(uint *)(&DAT_001cc03c + (ulong)(TVar3 - rule_localp0) * 4);
    }
  }
  *(int *)(puVar4 + 0x26) = (int)num_entries;
  ::std::istream::operator>>((istream *)is,(int *)local_70);
  if (local_70._0_4_ != 0) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_70,is);
    *(undefined4 *)(puVar4 + 4) = local_70._8_4_;
    puVar4[3] = local_70._0_8_;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar4 + 5),
               (vector<int,_std::allocator<int>_> *)&local_60);
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::operator>>((istream *)is,(int *)local_70);
  if (local_70._0_4_ != 0) {
    piVar7 = (pointer)(long)*(int *)((long)puVar4 + 0x14);
    piVar9 = (pointer)(long)*(int *)(puVar4 + 4);
    IO::readVector<TasGrid::IO::mode_ascii_type,double,unsigned_long>
              (&local_48,(IO *)is,(istream *)((long)piVar9 * (long)piVar7),num_entries);
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_48.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    puVar4[0x13] = piVar7;
    puVar4[0x14] = piVar9;
    local_70._0_8_ = piVar7;
    local_70._8_8_ = piVar9;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(puVar4 + 0x15),&local_60);
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::operator>>((istream *)is,(int *)local_70);
  if (local_70._0_4_ != 0) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>((MultiIndexSet *)local_70,is);
    lVar1 = *(long *)this;
    *(undefined4 *)(lVar1 + 0x48) = local_70._8_4_;
    *(undefined8 *)(lVar1 + 0x40) = local_70._0_8_;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x50),
               (vector<int,_std::allocator<int>_> *)&local_60);
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  lVar1 = *(long *)this;
  iVar5 = *(int *)(lVar1 + 0x130);
  ::std::istream::operator>>((istream *)is,(int *)local_70);
  if (local_70._0_4_ != 0) {
    bVar10 = (iVar5 - 1U & 0xfffffffd) != 0;
    piVar7 = (pointer)(long)*(int *)(lVar1 + 0x20);
    piVar9 = (pointer)(long)(*(int *)(lVar1 + 0x10) << bVar10);
    IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
              ((vector<int,_std::allocator<int>_> *)&local_48,(IO *)is,
               (istream *)((long)piVar7 * (long)piVar9),CONCAT71((int7)(num_entries >> 8),bVar10));
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_48.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(pointer *)(lVar1 + 0xc0) = piVar9;
    *(pointer *)(lVar1 + 200) = piVar7;
    local_70._0_8_ = piVar9;
    local_70._8_8_ = piVar7;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(lVar1 + 0xd0),
               (vector<int,_std::allocator<int>_> *)&local_60);
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  num_entries_00 = (int *)(lVar1 + 0x20);
  if (*(long *)(lVar1 + 0x28) == *(long *)(lVar1 + 0x30)) {
    num_entries_00 = (int *)(lVar1 + 0x48);
  }
  lVar6 = (long)*num_entries_00;
  ::std::istream::operator>>((istream *)is,(int *)&local_48);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,
             (long)(int)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,(allocator_type *)&local_48);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(lVar1 + 0xe8),local_70);
  if ((pointer)local_70._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_70._0_8_,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start - local_70._0_8_);
  }
  piVar8 = *(int **)(lVar1 + 0xe8);
  piVar2 = *(int **)(lVar1 + 0xf0);
  if (piVar2 != piVar8) {
    do {
      ::std::istream::operator>>((istream *)is,piVar8);
      piVar8 = piVar8 + 1;
    } while (piVar8 != piVar2);
    IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
              ((vector<int,_std::allocator<int>_> *)local_70,(IO *)is,(istream *)(lVar6 + 1),
               (unsigned_long)num_entries_00);
    iVar5 = (int)num_entries_00;
    ::std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x100),local_70);
    if ((pointer)local_70._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_70._0_8_,
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - local_70._0_8_);
    }
    piVar7 = (((vector<int,_std::allocator<int>_> *)(lVar1 + 0x100))->
             super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
    ;
    if (piVar7[lVar6] < 1) {
      IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
                ((vector<int,_std::allocator<int>_> *)local_70,(IO *)is,(istream *)0x1,iVar5);
    }
    else {
      IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
                ((vector<int,_std::allocator<int>_> *)local_70,(IO *)is,
                 (istream *)(ulong)(uint)piVar7[lVar6],iVar5);
    }
    ::std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x118),local_70);
    if ((pointer)local_70._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_70._0_8_,
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - local_70._0_8_);
    }
  }
  if (0 < *(int *)(lVar1 + 0x14)) {
    StorageSet::StorageSet<TasGrid::IO::mode_ascii_type>((StorageSet *)local_70,is);
    *(undefined8 *)(lVar1 + 0x68) = local_70._0_8_;
    *(undefined8 *)(lVar1 + 0x70) = local_70._8_8_;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x78),&local_60);
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return (__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridLocalPolynomial> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridLocalPolynomial> grid = Utils::make_unique<GridLocalPolynomial>(acc);

            grid->num_dimensions = IO::readNumber<iomode, int>(is);
            grid->num_outputs = IO::readNumber<iomode, int>(is);
            grid->order = IO::readNumber<iomode, int>(is);
            grid->top_level = IO::readNumber<iomode, int>(is);
            TypeOneDRule rule = IO::readRule<iomode>(is);
            grid->effective_rule = RuleLocal::getEffectiveRule(grid->order, rule);

            if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
            if (std::is_same<iomode, IO::mode_ascii_type>::value){ // backwards compatible: surpluses and needed, or needed and surpluses
                if (IO::readFlag<iomode>(is))
                    grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
                if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
            }else{
                if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());
                if (IO::readFlag<iomode>(is))
                    grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());
            }
            int max_parents = [&]()->int {
                    switch(grid->effective_rule) {
                        case RuleLocal::erule::pwc: return RuleLocal::getMaxNumParents<RuleLocal::erule::pwc>();
                        case RuleLocal::erule::localp: return RuleLocal::getMaxNumParents<RuleLocal::erule::localp>();
                        case RuleLocal::erule::semilocalp: return RuleLocal::getMaxNumParents<RuleLocal::erule::semilocalp>();
                        case RuleLocal::erule::localp0: return RuleLocal::getMaxNumParents<RuleLocal::erule::localp0>();
                        default: // case RuleLocal::erule::localpb:
                            return RuleLocal::getMaxNumParents<RuleLocal::erule::localpb>();
                    };
                }();

            if (IO::readFlag<iomode>(is))
                grid->parents = IO::readData2D<iomode, int>(is, max_parents * grid->num_dimensions, grid->points.getNumIndexes());

            size_t num_points = (size_t) ((grid->points.empty()) ? grid->needed.getNumIndexes() : grid->points.getNumIndexes());
            grid->roots = std::vector<int>((size_t) IO::readNumber<iomode, int>(is));
            if (grid->roots.size() > 0){
                IO::readVector<iomode>(is, grid->roots);
                grid->pntr = IO::readVector<iomode, int>(is, num_points + 1);
                if (grid->pntr[num_points] > 0){
                    grid->indx = IO::readVector<iomode, int>(is, grid->pntr[num_points]);
                }else{
                    grid->indx = IO::readVector<iomode, int>(is, 1);
                }
            }

            if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        return grid;
    }